

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O0

void P_CopyPlane(int tag,sector_t_conflict *dest,bool copyCeil)

{
  int iVar1;
  int secnum;
  sector_t_conflict *source;
  bool copyCeil_local;
  sector_t_conflict *dest_local;
  int tag_local;
  
  iVar1 = P_FindFirstSectorFromTag(tag);
  if (iVar1 != -1) {
    if (copyCeil) {
      secplane_t::operator=(&dest->ceilingplane,&sectors[iVar1].ceilingplane);
    }
    else {
      secplane_t::operator=(&dest->floorplane,&sectors[iVar1].floorplane);
    }
  }
  return;
}

Assistant:

static void P_CopyPlane (int tag, sector_t *dest, bool copyCeil)
{
	sector_t *source;
	int secnum;

	secnum = P_FindFirstSectorFromTag (tag);
	if (secnum == -1)
	{
		return;
	}

	source = &sectors[secnum];

	if (copyCeil)
	{
		dest->ceilingplane = source->ceilingplane;
	}
	else
	{
		dest->floorplane = source->floorplane;
	}
}